

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

bool slang::ast::CallExpression::checkConstant
               (EvalContext *context,SubroutineSymbol *subroutine,SourceRange range)

{
  string_view arg_00;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  SourceRange range_04;
  SourceRange range_05;
  SourceRange range_06;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  SourceLocation *pSVar4;
  Scope *this;
  Symbol *pSVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Symbol *in_RSI;
  Scope *scope;
  FormalArgumentSymbol *arg;
  iterator __end2;
  iterator __begin2;
  ArgList *__range2;
  bitmask<slang::ast::MethodFlags> *in_stack_fffffffffffffeb8;
  SubroutineSymbol *this_00;
  bitmask<slang::ast::MethodFlags> *in_stack_fffffffffffffec0;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  *__lhs;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *this_01;
  Diagnostic *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  SourceLocation in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff18;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffff20;
  DiagCode DVar6;
  ArgList local_d8;
  ArgList *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined4 local_ac;
  size_t local_a8;
  char *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_86;
  bitmask<slang::ast::MethodFlags> local_82;
  bitmask<slang::ast::MethodFlags> local_80;
  underlying_type local_7e;
  underlying_type local_7c;
  underlying_type local_7a;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_62;
  bitmask<slang::ast::MethodFlags> local_5e;
  underlying_type local_5c;
  underlying_type local_5a;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_46;
  bitmask<slang::ast::MethodFlags> local_42;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_2e;
  bitmask<slang::ast::EvalFlags> local_29;
  Symbol *local_28;
  undefined8 local_18;
  undefined8 local_10;
  bool local_1;
  
  DVar6 = SUB84((ulong)in_stack_ffffffffffffff20._M_current >> 0x20,0);
  local_28 = in_RSI;
  local_18 = in_RDX;
  local_10 = in_RCX;
  bitmask<slang::ast::EvalFlags>::bitmask(&local_29,IsScript);
  bVar1 = bitmask<slang::ast::EvalFlags>::has
                    ((bitmask<slang::ast::EvalFlags> *)in_stack_fffffffffffffec0,
                     (bitmask<slang::ast::EvalFlags> *)in_stack_fffffffffffffeb8);
  if (bVar1) {
    local_1 = true;
  }
  else if (*(int *)((long)&local_28[2].originatingSyntax + 4) == 1) {
    local_2e = 0x1d000c;
    local_40 = local_18;
    local_38 = local_10;
    range_00.endLoc = in_stack_ffffffffffffff18;
    range_00.startLoc = in_stack_ffffffffffffff10;
    EvalContext::addDiag
              ((EvalContext *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),DVar6,
               range_00);
    local_1 = false;
  }
  else {
    this_01 = (span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
              &local_28[3].field_0x4;
    bitmask<slang::ast::MethodFlags>::bitmask(&local_42,DPIImport);
    bVar1 = bitmask<slang::ast::MethodFlags>::has
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (bVar1) {
      local_46 = 0x7000c;
      local_58 = local_18;
      local_50 = local_10;
      range_01.endLoc = in_stack_ffffffffffffff18;
      range_01.startLoc = in_stack_ffffffffffffff10;
      EvalContext::addDiag
                ((EvalContext *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),DVar6,
                 range_01);
      local_1 = false;
    }
    else {
      __lhs = (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
               *)&local_28[3].field_0x4;
      local_5c = (underlying_type)
                 ast::operator|((MethodFlags)((ulong)__lhs >> 0x20),
                                (MethodFlags)((ulong)__lhs >> 0x10));
      bitmask<slang::ast::MethodFlags>::bitmask(&local_5e,Constructor);
      local_5a = (underlying_type)
                 bitmask<slang::ast::MethodFlags>::operator|
                           ((bitmask<slang::ast::MethodFlags> *)this_01,
                            (bitmask<slang::ast::MethodFlags> *)__lhs);
      bVar1 = bitmask<slang::ast::MethodFlags>::has
                        ((bitmask<slang::ast::MethodFlags> *)__lhs,in_stack_fffffffffffffeb8);
      if (bVar1) {
        local_62 = 0x12000c;
        local_78 = local_18;
        local_70 = local_10;
        range_02.endLoc = in_stack_ffffffffffffff18;
        range_02.startLoc = in_stack_ffffffffffffff10;
        EvalContext::addDiag
                  ((EvalContext *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   DVar6,range_02);
        local_1 = false;
      }
      else {
        this_00 = (SubroutineSymbol *)&local_28[3].field_0x4;
        local_7e = (underlying_type)
                   ast::operator|((MethodFlags)((ulong)__lhs >> 0x20),
                                  (MethodFlags)((ulong)__lhs >> 0x10));
        bitmask<slang::ast::MethodFlags>::bitmask(&local_80,ModportExport);
        local_7c = (underlying_type)
                   bitmask<slang::ast::MethodFlags>::operator|
                             ((bitmask<slang::ast::MethodFlags> *)this_01,
                              (bitmask<slang::ast::MethodFlags> *)__lhs);
        bitmask<slang::ast::MethodFlags>::bitmask(&local_82,ModportImport);
        local_7a = (underlying_type)
                   bitmask<slang::ast::MethodFlags>::operator|
                             ((bitmask<slang::ast::MethodFlags> *)this_01,
                              (bitmask<slang::ast::MethodFlags> *)__lhs);
        bVar1 = bitmask<slang::ast::MethodFlags>::has
                          ((bitmask<slang::ast::MethodFlags> *)__lhs,
                           (bitmask<slang::ast::MethodFlags> *)this_00);
        if (bVar1) {
          local_86 = 0x1b000c;
          local_98 = local_18;
          local_90 = local_10;
          range_03.endLoc = in_stack_ffffffffffffff18;
          range_03.startLoc = in_stack_ffffffffffffff10;
          EvalContext::addDiag
                    ((EvalContext *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     DVar6,range_03);
          local_a8 = (local_28->name)._M_len;
          local_a0 = (local_28->name)._M_str;
          arg_00._M_len._4_4_ = in_stack_ffffffffffffff0c;
          arg_00._M_len._0_4_ = in_stack_ffffffffffffff08;
          arg_00._M_str = (char *)in_stack_ffffffffffffff10;
          Diagnostic::operator<<(in_stack_ffffffffffffff00,arg_00);
          local_1 = false;
        }
        else {
          SubroutineSymbol::getReturnType((SubroutineSymbol *)0x97b3dc);
          bVar1 = Type::isVoid((Type *)0x97b3e4);
          if (bVar1) {
            local_ac = 0x1f000c;
            local_c0 = local_18;
            local_b8 = local_10;
            range_04.endLoc = in_stack_ffffffffffffff18;
            range_04.startLoc = in_stack_ffffffffffffff10;
            EvalContext::addDiag
                      ((EvalContext *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       DVar6,range_04);
            local_1 = false;
          }
          else {
            local_d8 = SubroutineSymbol::getArguments(this_00);
            local_c8 = &local_d8;
            iVar2 = std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                    ::begin((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                             *)this_00);
            iVar3 = std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                    ::end(this_01);
            while (bVar1 = __gnu_cxx::
                           operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                     (__lhs,(__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                             *)this_00),
                  DVar6 = SUB84((ulong)iVar2._M_current >> 0x20,0), ((bVar1 ^ 0xffU) & 1) != 0) {
              pSVar4 = (SourceLocation *)
                       __gnu_cxx::
                       __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                       ::operator*((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                    *)&stack0xffffffffffffff20);
              in_stack_ffffffffffffff10 = *pSVar4;
              if (*(int *)((long)in_stack_ffffffffffffff10 + 0x158) != 0) {
                range_05.endLoc = (SourceLocation)iVar3._M_current;
                range_05.startLoc = in_stack_ffffffffffffff10;
                EvalContext::addDiag
                          ((EvalContext *)CONCAT44(0xc000c,in_stack_ffffffffffffff08),
                           SUB84((ulong)iVar2._M_current >> 0x20,0),range_05);
                return false;
              }
              __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator++((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                            *)&stack0xffffffffffffff20);
            }
            this = Symbol::getParentScope(local_28);
            pSVar5 = Scope::asSymbol(this);
            if (pSVar5->kind == GenerateBlock) {
              range_06.endLoc = (SourceLocation)iVar3._M_current;
              range_06.startLoc = in_stack_ffffffffffffff10;
              EvalContext::addDiag
                        ((EvalContext *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),DVar6,
                         range_06);
              local_1 = false;
            }
            else {
              local_1 = true;
            }
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool CallExpression::checkConstant(EvalContext& context, const SubroutineSymbol& subroutine,
                                   SourceRange range) {
    if (context.flags.has(EvalFlags::IsScript))
        return true;

    if (subroutine.subroutineKind == SubroutineKind::Task) {
        context.addDiag(diag::ConstEvalTaskNotConstant, range);
        return false;
    }

    if (subroutine.flags.has(MethodFlags::DPIImport)) {
        context.addDiag(diag::ConstEvalDPINotConstant, range);
        return false;
    }

    if (subroutine.flags.has(MethodFlags::Virtual | MethodFlags::Pure | MethodFlags::Constructor)) {
        context.addDiag(diag::ConstEvalMethodNotConstant, range);
        return false;
    }

    if (subroutine.flags.has(MethodFlags::BuiltIn | MethodFlags::InterfaceExtern |
                             MethodFlags::ModportExport | MethodFlags::ModportImport)) {
        context.addDiag(diag::ConstEvalSubroutineNotConstant, range) << subroutine.name;
        return false;
    }

    if (subroutine.getReturnType().isVoid()) {
        context.addDiag(diag::ConstEvalVoidNotConstant, range);
        return false;
    }

    for (auto arg : subroutine.getArguments()) {
        if (arg->direction != ArgumentDirection::In) {
            context.addDiag(diag::ConstEvalFunctionArgDirection, range);
            return false;
        }
    }

    auto scope = subroutine.getParentScope();
    SLANG_ASSERT(scope);
    if (scope->asSymbol().kind == SymbolKind::GenerateBlock) {
        context.addDiag(diag::ConstEvalFunctionInsideGenerate, range);
        return false;
    }

    return true;
}